

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

void __thiscall Socket_Write_Test::TestBody(Socket_Write_Test *this)

{
  int handle;
  Socket socket;
  ServerSocket server;
  thread thread;
  size_t length;
  char *data;
  undefined1 local_20 [16];
  
  data = "Hello, World\n";
  length = 0xe;
  server.m_Handle =
       socketsys::UnixServerProvider::init((UnixServerProvider *)0x0,(EVP_PKEY_CTX *)0x0);
  local_20._0_2_ = 9;
  local_20[2] = '\0';
  local_20[3] = '\0';
  local_20[4] = '\0';
  local_20[5] = '\0';
  local_20[6] = '\0';
  local_20[7] = '\0';
  local_20._8_8_ = "127.0.0.1";
  socketsys::UnixServerProvider::bind
            ((UnixServerProvider *)(ulong)(uint)server.m_Handle,(int)local_20,(sockaddr *)0x697a,
             0x14);
  thread._M_id._M_thread = (id)0;
  local_20._0_8_ = operator_new(0x20);
  *(undefined ***)local_20._0_8_ = &PTR___State_00144590;
  *(ServerSocket **)(local_20._0_8_ + 8) = &server;
  *(size_t **)(local_20._0_8_ + 0x10) = &length;
  *(char ***)(local_20._0_8_ + 0x18) = &data;
  std::thread::_M_start_thread(&thread,local_20,0);
  if ((long *)local_20._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_20._0_8_ + 8))();
  }
  handle = socketsys::UnixProvider::init((UnixProvider *)0x0,(EVP_PKEY_CTX *)0x0);
  socket.m_Handle = handle;
  socketsys::UnixProvider::setSoLinger(handle,false,0);
  local_20._0_2_ = 9;
  local_20[2] = '\0';
  local_20[3] = '\0';
  local_20[4] = '\0';
  local_20[5] = '\0';
  local_20[6] = '\0';
  local_20[7] = '\0';
  local_20._8_8_ = "127.0.0.1";
  socketsys::UnixProvider::connect(handle,(sockaddr *)local_20,0x697a);
  socketsys::UnixProvider::write(socket.m_Handle,data,length);
  socketsys::SocketInterface<socketsys::UnixProvider>::~SocketInterface(&socket);
  std::thread::join();
  std::thread::~thread(&thread);
  socketsys::ServerSocketInterface<socketsys::UnixServerProvider>::~ServerSocketInterface(&server);
  return;
}

Assistant:

TEST(Socket, Write) {
    constexpr uint16_t PORT = 27002;

    const char* data = "Hello, World\n";
    size_t length = strlen(data) + 1;

    ServerSocket server;
    server.bind("127.0.0.1", PORT);

    std::thread thread([&]() {
        try {
            auto handle = server.accept();
            handle.setSoLinger(false, 0);

            std::vector<char> buffer(length);
            size_t read = handle.read(buffer);
            while (read != length) read += handle.read(buffer);

            EXPECT_TRUE(strcmp(buffer.data(), data) == 0);
        } catch (const std::exception& ex) {
            FAIL() << ex.what() << '\n';
        }
    });

    {
        Socket socket;
        socket.setSoLinger(false, 0);
        socket.connect("127.0.0.1", PORT);
        socket.write(data, length);
    }

    thread.join();
}